

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall
QWizard::setDefaultProperty(QWizard *this,char *className,char *property,char *changedSignal)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QWizardDefaultProperty local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  uVar4 = *(uint *)(lVar1 + 0x318);
  do {
    uVar4 = uVar4 - 1;
    if ((int)uVar4 < 0) goto LAB_004c4a2a;
    pcVar3 = *(char **)(*(long *)(lVar1 + 0x310) + 8 + (long)(ulong)(uVar4 & 0x7fffffff) * 0x48);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    iVar2 = qstrcmp(pcVar3,className);
  } while (iVar2 != 0);
  QList<QWizardDefaultProperty>::remove
            ((QList<QWizardDefaultProperty> *)(lVar1 + 0x308),(char *)(ulong)(uVar4 & 0x7fffffff));
LAB_004c4a2a:
  QWizardDefaultProperty::QWizardDefaultProperty(&local_80,className,property,changedSignal);
  QList<QWizardDefaultProperty>::emplaceBack<QWizardDefaultProperty>
            ((QList<QWizardDefaultProperty> *)(lVar1 + 0x308),&local_80);
  QWizardDefaultProperty::~QWizardDefaultProperty(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setDefaultProperty(const char *className, const char *property,
                                 const char *changedSignal)
{
    Q_D(QWizard);
    for (int i = d->defaultPropertyTable.size() - 1; i >= 0; --i) {
        if (qstrcmp(d->defaultPropertyTable.at(i).className, className) == 0) {
            d->defaultPropertyTable.remove(i);
            break;
        }
    }
    d->defaultPropertyTable.append(QWizardDefaultProperty(className, property, changedSignal));
}